

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestCaseGroup * vkt::rasterization::createTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"rasterization",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Rasterization Tests",&local_4a);
  pTVar1 = createTestGroup(testCtx,&local_28,&local_48,anon_unknown_0::createRasterizationTests);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createTests (tcu::TestContext& testCtx)
{
	return createTestGroup(testCtx, "rasterization", "Rasterization Tests", createRasterizationTests);
}